

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O3

int __thiscall musicBlock::OPLloadBank(musicBlock *this,FileReader *data)

{
  int iVar1;
  OP2instrEntry *pOVar2;
  uchar filehdr [8];
  long local_20;
  
  (*(data->super_FileReaderBase)._vptr_FileReaderBase[2])(data,&local_20,8);
  iVar1 = -2;
  if (local_20 == 0x2349495f4c504f23) {
    pOVar2 = (OP2instrEntry *)calloc(0xaf,0x24);
    if (pOVar2 == (OP2instrEntry *)0x0) {
      iVar1 = -3;
    }
    else {
      (*(data->super_FileReaderBase)._vptr_FileReaderBase[2])(data,pOVar2,0x189c);
      if (this->OPLinstruments != (OP2instrEntry *)0x0) {
        free(this->OPLinstruments);
      }
      this->OPLinstruments = pOVar2;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int musicBlock::OPLloadBank (FileReader &data)
{
	static const uchar masterhdr[8] = { '#','O','P','L','_','I','I','#' };
	struct OP2instrEntry *instruments;

	uchar filehdr[8];

	data.Read (filehdr, 8);
	if (memcmp(filehdr, masterhdr, 8))
		return -2;			/* bad instrument file */
	if ( (instruments = (struct OP2instrEntry *)calloc(OP2INSTRCOUNT, OP2INSTRSIZE)) == NULL)
		return -3;			/* not enough memory */
	data.Read (instruments, OP2INSTRSIZE * OP2INSTRCOUNT);
	if (OPLinstruments != NULL)
	{
		free(OPLinstruments);
	}
	OPLinstruments = instruments;
#if 0
	for (int i = 0; i < 175; ++i)
	{
		Printf ("%3d.%-33s%3d %3d %3d %d\n", i,
			(BYTE *)data+6308+i*32,
			OPLinstruments[i].instr[0].basenote,
			OPLinstruments[i].instr[1].basenote,
			OPLinstruments[i].note,
			OPLinstruments[i].flags);
	}
#endif
	return 0;
}